

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::detail::loader_life_support::~loader_life_support(loader_life_support *this)

{
  bool bVar1;
  internals *piVar2;
  vector<_object_*,_std::allocator<_object_*>_> *this_00;
  reference pp_Var3;
  size_type sVar4;
  size_type sVar5;
  PyObject *_py_tmp;
  value_type ptr;
  vector<_object_*,_std::allocator<_object_*>_> *stack;
  vector<_object_*,_std::allocator<_object_*>_> *in_stack_ffffffffffffffd0;
  vector<_object_*,_std::allocator<_object_*>_> *in_stack_ffffffffffffffe0;
  value_type this_01;
  
  piVar2 = get_internals();
  this_00 = &piVar2->loader_patient_stack;
  bVar1 = std::vector<_object_*,_std::allocator<_object_*>_>::empty(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    pp_Var3 = std::vector<_object_*,_std::allocator<_object_*>_>::back(in_stack_ffffffffffffffd0);
    this_01 = *pp_Var3;
    std::vector<_object_*,_std::allocator<_object_*>_>::pop_back
              ((vector<_object_*,_std::allocator<_object_*>_> *)0x25fb2f);
    if (this_01 != (value_type)0x0) {
      _Py_DECREF((PyObject *)0x25fb54);
    }
    sVar4 = std::vector<_object_*,_std::allocator<_object_*>_>::capacity(this_00);
    if (0x10 < sVar4) {
      bVar1 = std::vector<_object_*,_std::allocator<_object_*>_>::empty
                        ((vector<_object_*,_std::allocator<_object_*>_> *)this_01);
      if (!bVar1) {
        sVar4 = std::vector<_object_*,_std::allocator<_object_*>_>::capacity(this_00);
        sVar5 = std::vector<_object_*,_std::allocator<_object_*>_>::size(this_00);
        if (2 < sVar4 / sVar5) {
          std::vector<_object_*,_std::allocator<_object_*>_>::shrink_to_fit
                    ((vector<_object_*,_std::allocator<_object_*>_> *)0x25fbb0);
        }
      }
    }
    return;
  }
  pybind11_fail((char *)in_stack_ffffffffffffffe0);
}

Assistant:

~loader_life_support() {
        auto &stack = get_internals().loader_patient_stack;
        if (stack.empty())
            pybind11_fail("loader_life_support: internal error");

        auto ptr = stack.back();
        stack.pop_back();
        Py_CLEAR(ptr);

        // A heuristic to reduce the stack's capacity (e.g. after long recursive calls)
        if (stack.capacity() > 16 && !stack.empty() && stack.capacity() / stack.size() > 2)
            stack.shrink_to_fit();
    }